

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

cl_command_queue __thiscall
CLIntercept::getCommandBufferCommandQueue
          (CLIntercept *this,cl_uint numQueues,cl_command_queue *queues,cl_command_buffer_khr cmdbuf
          )

{
  mutex *__mutex;
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  mapped_type *pmVar5;
  undefined8 uVar6;
  _Base_ptr p_Var7;
  cl_command_queue p_Var8;
  _Rb_tree_header *p_Var9;
  cl_command_queue queue;
  vector<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_> queues_1;
  allocator_type local_5d;
  cl_uint local_5c;
  cl_command_queue local_58;
  undefined1 local_50 [32];
  
  if (queues == (cl_command_queue *)0x0 || numQueues == 0) {
    __mutex = &this->m_Mutex;
    local_5c = numQueues;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar2 != 0) {
      uVar6 = std::__throw_system_error(iVar2);
      if ((key_type)local_50._0_8_ != (key_type)0x0) {
        operator_delete((void *)local_50._0_8_);
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar6);
    }
    local_58 = (cl_command_queue)0x0;
    p_Var1 = &(this->m_CommandBufferInfoMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = (this->m_CommandBufferInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var3 = &p_Var1->_M_header;
    for (; p_Var7 != (_Base_ptr)0x0;
        p_Var7 = (&p_Var7->_M_left)[*(cl_command_buffer_khr *)(p_Var7 + 1) < cmdbuf]) {
      if (*(cl_command_buffer_khr *)(p_Var7 + 1) >= cmdbuf) {
        p_Var3 = p_Var7;
      }
    }
    p_Var7 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
       (p_Var7 = p_Var3, cmdbuf < *(cl_command_buffer_khr *)(p_Var3 + 1))) {
      p_Var7 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var7 != p_Var1) {
      p_Var7 = p_Var7[1]._M_parent;
      p_Var1 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var4 = &p_Var1->_M_header;
      for (; p_Var3 != (_Base_ptr)0x0;
          p_Var3 = (&p_Var3->_M_left)[*(_Base_ptr *)(p_Var3 + 1) < p_Var7]) {
        if (*(_Base_ptr *)(p_Var3 + 1) >= p_Var7) {
          p_Var4 = p_Var3;
        }
      }
      p_Var3 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
         (p_Var3 = p_Var4, p_Var7 < *(_Base_ptr *)(p_Var4 + 1))) {
        p_Var3 = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)p_Var3 == p_Var1) {
        local_50._0_8_ = (key_type)0x0;
        pmVar5 = std::
                 map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
                 ::at(&this->m_DispatchX,(key_type *)local_50);
      }
      else {
        pmVar5 = (mapped_type *)&p_Var3[1]._M_parent;
      }
      if (pmVar5->clGetCommandBufferInfoKHR ==
          (_func_cl_int_cl_command_buffer_khr_cl_command_buffer_info_khr_size_t_void_ptr_size_t_ptr
           *)0x0) {
        local_50._0_8_ = local_50 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"clGetCommandBufferInfoKHR","");
        getExtensionFunctionAddress(this,(cl_platform_id)p_Var7,(string *)local_50);
        if ((key_type)local_50._0_8_ != (key_type)(local_50 + 0x10)) {
          operator_delete((void *)local_50._0_8_);
        }
      }
      p_Var3 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var4 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
          p_Var3 = (&p_Var3->_M_left)[*(_Base_ptr *)(p_Var3 + 1) < p_Var7]) {
        if (*(_Base_ptr *)(p_Var3 + 1) >= p_Var7) {
          p_Var4 = p_Var3;
        }
      }
      p_Var9 = p_Var1;
      if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
         (p_Var9 = (_Rb_tree_header *)p_Var4,
         p_Var7 < (_Base_ptr)((_Rb_tree_header *)p_Var4)->_M_node_count)) {
        p_Var9 = p_Var1;
      }
      if (p_Var9 == p_Var1) {
        local_50._0_8_ = (key_type)0x0;
        pmVar5 = std::
                 map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
                 ::at(&this->m_DispatchX,(key_type *)local_50);
      }
      else {
        pmVar5 = (mapped_type *)(p_Var9 + 1);
      }
      if (pmVar5->clGetCommandBufferInfoKHR !=
          (_func_cl_int_cl_command_buffer_khr_cl_command_buffer_info_khr_size_t_void_ptr_size_t_ptr
           *)0x0) {
        (*pmVar5->clGetCommandBufferInfoKHR)(cmdbuf,0x1295,4,&local_5c,(size_t *)0x0);
        if ((ulong)local_5c != 0) {
          if (local_5c == 1) {
            (*pmVar5->clGetCommandBufferInfoKHR)(cmdbuf,0x1294,8,&local_58,(size_t *)0x0);
          }
          else {
            std::vector<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>::vector
                      ((vector<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_> *)local_50
                       ,(ulong)local_5c,&local_5d);
            (*pmVar5->clGetCommandBufferInfoKHR)
                      (cmdbuf,0x1294,local_50._8_8_ - local_50._0_8_,(void *)local_50._0_8_,
                       (size_t *)0x0);
            local_58 = *(cl_command_queue *)local_50._0_8_;
            operator_delete((void *)local_50._0_8_);
          }
        }
      }
    }
    p_Var8 = local_58;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  else {
    p_Var8 = *queues;
  }
  return p_Var8;
}

Assistant:

cl_command_queue CLIntercept::getCommandBufferCommandQueue(
    cl_uint numQueues,
    const cl_command_queue* queues,
    cl_command_buffer_khr cmdbuf )
{
    if( numQueues != 0 && queues != NULL )
    {
        return queues[0];
    }

    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_command_queue    queue = NULL;

    CCommandBufferInfoMap::iterator iter = m_CommandBufferInfoMap.find( cmdbuf );
    if( iter != m_CommandBufferInfoMap.end() )
    {
        cl_platform_id  platform = iter->second;
        if( dispatchX(platform).clGetCommandBufferInfoKHR == NULL )
        {
            getExtensionFunctionAddress(
                platform,
                "clGetCommandBufferInfoKHR" );
        }

        const auto& dispatchX = this->dispatchX(platform);
        if( dispatchX.clGetCommandBufferInfoKHR )
        {
            dispatchX.clGetCommandBufferInfoKHR(
                cmdbuf,
                CL_COMMAND_BUFFER_NUM_QUEUES_KHR,
                sizeof( numQueues ),
                &numQueues,
                NULL );
            if( numQueues == 1)
            {
                dispatchX.clGetCommandBufferInfoKHR(
                    cmdbuf,
                    CL_COMMAND_BUFFER_QUEUES_KHR,
                    sizeof( queue ),
                    &queue,
                    NULL );
            }
            else if( numQueues > 1 )
            {
                std::vector<cl_command_queue> queues(numQueues);
                dispatchX.clGetCommandBufferInfoKHR(
                    cmdbuf,
                    CL_COMMAND_BUFFER_QUEUES_KHR,
                    queues.size() * sizeof(queues[0]),
                    queues.data(),
                    NULL );
                queue = queues[0];
            }
        }
    }

    return queue;
}